

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

void __thiscall dgrminer::PartialUnion::debug_printNodes(PartialUnion *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  ostream *poVar4;
  ulong local_20;
  size_t j;
  size_t i;
  PartialUnion *this_local;
  
  j = 0;
  while( true ) {
    sVar1 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::size
                      (&this->nodes);
    if (sVar1 <= j) break;
    local_20 = 0;
    while( true ) {
      pvVar2 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                         (&this->nodes,j);
      sVar1 = std::array<int,_6UL>::size(pvVar2);
      if (sVar1 <= local_20) break;
      pvVar2 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                         (&this->nodes,j);
      pvVar3 = std::array<int,_6UL>::operator[](pvVar2,local_20);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar3);
      std::operator<<(poVar4,"\t");
      local_20 = local_20 + 1;
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    j = j + 1;
  }
  return;
}

Assistant:

void PartialUnion::debug_printNodes()
	{
		for (size_t i = 0; i < nodes.size(); i++)
		{
			for (size_t j = 0; j < nodes[i].size(); j++)
			{
				std::cout << nodes[i][j] << "\t";
			}
			std::cout << std::endl;
		}
	}